

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O1

void __thiscall TiXmlNode::TiXmlNode(TiXmlNode *this,NodeType _type)

{
  (this->super_TiXmlBase).location.row = -1;
  (this->super_TiXmlBase).location.col = -1;
  (this->super_TiXmlBase).userData = (void *)0x0;
  this->parent = (TiXmlNode *)0x0;
  (this->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_002186e0;
  (this->value).rep_ = &TiXmlString::nullrep_;
  this->type = _type;
  this->firstChild = (TiXmlNode *)0x0;
  this->lastChild = (TiXmlNode *)0x0;
  this->prev = (TiXmlNode *)0x0;
  this->next = (TiXmlNode *)0x0;
  return;
}

Assistant:

void Clear()		{ row = col = -1; }